

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::erase_meta_only(raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
                  *this,const_iterator it)

{
  int iVar1;
  uint uVar2;
  ushort uVar3;
  ushort uVar4;
  ctrl_t h;
  char *pcVar5;
  size_t i;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i match;
  
  pcVar5 = it.inner_.ctrl_;
  if (-1 < *pcVar5) {
    this->size_ = this->size_ - 1;
    i = (long)pcVar5 - (long)this->ctrl_;
    auVar7[0] = -(*pcVar5 == -0x80);
    auVar7[1] = -(pcVar5[1] == -0x80);
    auVar7[2] = -(pcVar5[2] == -0x80);
    auVar7[3] = -(pcVar5[3] == -0x80);
    auVar7[4] = -(pcVar5[4] == -0x80);
    auVar7[5] = -(pcVar5[5] == -0x80);
    auVar7[6] = -(pcVar5[6] == -0x80);
    auVar7[7] = -(pcVar5[7] == -0x80);
    auVar7[8] = -(pcVar5[8] == -0x80);
    auVar7[9] = -(pcVar5[9] == -0x80);
    auVar7[10] = -(pcVar5[10] == -0x80);
    auVar7[0xb] = -(pcVar5[0xb] == -0x80);
    auVar7[0xc] = -(pcVar5[0xc] == -0x80);
    auVar7[0xd] = -(pcVar5[0xd] == -0x80);
    auVar7[0xe] = -(pcVar5[0xe] == -0x80);
    auVar7[0xf] = -(pcVar5[0xf] == -0x80);
    uVar3 = (ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf;
    pcVar5 = this->ctrl_ + (i - 0x10 & this->capacity_);
    auVar8[0] = -(*pcVar5 == -0x80);
    auVar8[1] = -(pcVar5[1] == -0x80);
    auVar8[2] = -(pcVar5[2] == -0x80);
    auVar8[3] = -(pcVar5[3] == -0x80);
    auVar8[4] = -(pcVar5[4] == -0x80);
    auVar8[5] = -(pcVar5[5] == -0x80);
    auVar8[6] = -(pcVar5[6] == -0x80);
    auVar8[7] = -(pcVar5[7] == -0x80);
    auVar8[8] = -(pcVar5[8] == -0x80);
    auVar8[9] = -(pcVar5[9] == -0x80);
    auVar8[10] = -(pcVar5[10] == -0x80);
    auVar8[0xb] = -(pcVar5[0xb] == -0x80);
    auVar8[0xc] = -(pcVar5[0xc] == -0x80);
    auVar8[0xd] = -(pcVar5[0xd] == -0x80);
    auVar8[0xe] = -(pcVar5[0xe] == -0x80);
    auVar8[0xf] = -(pcVar5[0xf] == -0x80);
    uVar4 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf;
    if (uVar3 == 0 || uVar4 == 0) {
      bVar6 = false;
    }
    else {
      iVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> iVar1 & 1) == 0; iVar1 = iVar1 + 1) {
        }
      }
      uVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; ((uint)uVar4 << 0x10) >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      bVar6 = (uVar2 ^ 0x1f) + iVar1 < 0x10;
    }
    h = -2;
    if (bVar6 != false) {
      h = -0x80;
    }
    set_ctrl(this,i,h);
    (this->settings_).
    super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>,_0UL,_false>
    .value = (this->settings_).
             super_CompressedTupleImpl<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
             .
             super_Storage<phmap::container_internal::CompressedTuple<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>,_0UL,_false>
             .value + (ulong)bVar6;
    return;
  }
  __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x6f5,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, VarState>>>::erase_meta_only(const_iterator) [Policy = phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, VarState>>]"
               );
}

Assistant:

inline bool IsFull(ctrl_t c)           { return c >= 0; }